

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

void __thiscall
QFontEngineMulti::QFontEngineMulti
          (QFontEngineMulti *this,QFontEngine *engine,int script,QStringList *fallbackFamilies)

{
  long lVar1;
  bool bVar2;
  reference ppQVar3;
  undefined4 in_EDX;
  QFontEngine *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff98;
  Type in_stack_ffffffffffffff9c;
  QFontEngine *in_stack_ffffffffffffffa0;
  QFontDef *this_00;
  qsizetype in_stack_ffffffffffffffa8;
  QFontEngine *pQVar4;
  QList<QFontEngine_*> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFontEngine::QFontEngine(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  *in_RDI = &PTR__QFontEngineMulti_00e1ea50;
  QList<QFontEngine_*>::QList((QList<QFontEngine_*> *)0x763c7c);
  QList<QString>::QList
            ((QList<QString> *)in_stack_ffffffffffffffa0,
             (QList<QString> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *(undefined4 *)(in_RDI + 0x25) = in_EDX;
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x763cad);
  *(byte *)((long)in_RDI + 300) = (bVar2 ^ 0xffU) & 1;
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x763cc8);
  if (bVar2) {
    in_stack_ffffffffffffffb0 = (QList<QFontEngine_*> *)(in_RDI + 0x22);
    QString::QString((QString *)0x763ce8);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_ffffffffffffffa0,
               (rvalue_ref)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QString::~QString((QString *)0x763d01);
  }
  this_00 = (QFontDef *)(in_RDI + 0x1f);
  QList<QString>::size((QList<QString> *)(in_RDI + 0x22));
  QList<QFontEngine_*>::resize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x763d3e);
  pQVar4 = in_RSI;
  ppQVar3 = QList<QFontEngine_*>::operator[]
                      ((QList<QFontEngine_*> *)this_00,
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *ppQVar3 = pQVar4;
  QFontDef::operator=(this_00,(QFontDef *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *(uint *)(in_RDI + 0x15) = in_RSI->cache_cost;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QFontEngineMulti::QFontEngineMulti(QFontEngine *engine, int script, const QStringList &fallbackFamilies)
    : QFontEngine(Multi),
      m_fallbackFamilies(fallbackFamilies),
      m_script(script),
      m_fallbackFamiliesQueried(!m_fallbackFamilies.isEmpty())
{
    Q_ASSERT(engine && engine->type() != QFontEngine::Multi);

    if (m_fallbackFamilies.isEmpty()) {
        // defer obtaining the fallback families until loadEngine(1)
        m_fallbackFamilies << QString();
    }

    m_engines.resize(m_fallbackFamilies.size() + 1);

    engine->ref.ref();
    m_engines[0] = engine;

    fontDef = engine->fontDef;
    cache_cost = engine->cache_cost;
}